

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void printVector<double>(vector<double,_std::allocator<double>_> *vector)

{
  pointer pdVar1;
  ostream *poVar2;
  int i;
  ulong uVar3;
  
  for (uVar3 = 0;
      pdVar1 = (vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar1 >> 3);
      uVar3 = uVar3 + 1) {
    poVar2 = std::ostream::_M_insert<double>(pdVar1[uVar3]);
    std::operator<<(poVar2,',');
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void printVector(const std::vector<T> &vector){
    for(int i=0;i<vector.size();i++){
        std::cout<<vector[i]<<',';
    }
    std::cout<<std::endl;
}